

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSynth.c
# Opt level: O0

void Gia_ManNormalizeEquivalences(Gia_Man_t *p,int *pReprs)

{
  int iVar1;
  Gia_Rpr_t *pGVar2;
  int *piVar3;
  int local_1c;
  int iRepr;
  int i;
  int *pReprs_local;
  Gia_Man_t *p_local;
  
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSynth.c"
                  ,0x109,"void Gia_ManNormalizeEquivalences(Gia_Man_t *, int *)");
  }
  if (p->pNexts != (int *)0x0) {
    __assert_fail("p->pNexts == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSynth.c"
                  ,0x10a,"void Gia_ManNormalizeEquivalences(Gia_Man_t *, int *)");
  }
  iVar1 = Gia_ManObjNum(p);
  pGVar2 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  p->pReprs = pGVar2;
  for (local_1c = 0; iVar1 = Gia_ManObjNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
    Gia_ObjSetRepr(p,local_1c,0xfffffff);
  }
  for (local_1c = 0; iVar1 = Gia_ManObjNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
    if (pReprs[local_1c] != -1) {
      iVar1 = Gia_ManFindRepr_rec(pReprs,local_1c);
      Gia_ObjSetRepr(p,local_1c,iVar1);
    }
  }
  piVar3 = Gia_ManDeriveNexts(p);
  p->pNexts = piVar3;
  return;
}

Assistant:

void Gia_ManNormalizeEquivalences( Gia_Man_t * p, int * pReprs )
{
    int i, iRepr;
    assert( p->pReprs == NULL );
    assert( p->pNexts == NULL );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( p, i, GIA_VOID );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
    {
        if ( pReprs[i] == ~0 )
            continue;
        iRepr = Gia_ManFindRepr_rec( pReprs, i );
        Gia_ObjSetRepr( p, i, iRepr );
    }
    p->pNexts = Gia_ManDeriveNexts( p );
}